

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O3

PropReqs *
yactfr::internal::JsonStrTypeValReq::_buildPropReqs
          (PropReqs *__return_storage_ptr__,PropReqs *propReqs)

{
  long *plVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_141;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_140;
  allocator local_13f;
  allocator local_13e;
  allocator local_13d;
  allocator local_13c;
  allocator local_13b;
  allocator local_13a;
  undefined1 local_139;
  Sp local_138;
  JsonScalarValInSetReq<yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>,_(yactfr::internal::JsonValKind)5>
  *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_120 [2];
  string local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [16];
  long local_30 [2];
  
  std::__cxx11::string::string((string *)&local_110,"encoding",&local_13a);
  std::__cxx11::string::string((string *)&local_c0,"utf-8",&local_13b);
  std::__cxx11::string::string(local_a0,"utf-16be",&local_13c);
  std::__cxx11::string::string(local_80,"utf-16le",&local_13d);
  std::__cxx11::string::string(local_60,"utf-32be",&local_13e);
  std::__cxx11::string::string(local_40,"utf-32le",&local_13f);
  __l._M_len = 5;
  __l._M_array = &local_c0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_f0,__l,&local_140,&local_141);
  local_128 = (JsonScalarValInSetReq<yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>,_(yactfr::internal::JsonValKind)5>
               *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<yactfr::internal::JsonScalarValInSetReq<yactfr::internal::JsonScalarVal<std::__cxx11::string,(yactfr::internal::JsonValKind)5>,(yactfr::internal::JsonValKind)5>,std::allocator<yactfr::internal::JsonScalarValInSetReq<yactfr::internal::JsonScalarVal<std::__cxx11::string,(yactfr::internal::JsonValKind)5>,(yactfr::internal::JsonValKind)5>>,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            (a_Stack_120,&local_128,
             (allocator<yactfr::internal::JsonScalarValInSetReq<yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>,_(yactfr::internal::JsonValKind)5>_>
              *)&local_139,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_f0);
  local_138.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &local_128->super_JsonValReq;
  local_138.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = a_Stack_120[0]._M_pi;
  anon_unknown_0::addToPropReqs(propReqs,&local_110,&local_138,false);
  if (local_138.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.
               super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_f0);
  lVar2 = -0xa0;
  plVar1 = local_30;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,propReqs,propReqs);
  return __return_storage_ptr__;
}

Assistant:

static PropReqs _buildPropReqs(PropReqs&& propReqs)
    {
        addToPropReqs(propReqs, strs::encoding, JsonStrValInSetReq::shared({
            strs::utf8,
            strs::utf16Be,
            strs::utf16Le,
            strs::utf32Be,
            strs::utf32Le,
        }));
        return std::move(propReqs);
    }